

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckParagraphHeader(TidyDocImpl *doc,Node *node)

{
  bool bVar1;
  Bool BVar2;
  Node *local_28;
  Node *temp;
  Bool IsNotHeader;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  bVar1 = false;
  BVar2 = Level2_Enabled(doc);
  if ((BVar2 != no) && (node->content != (Node *)0x0)) {
    if (node->content->tag != (Dict *)0x0) {
      for (local_28 = node->content; local_28 != (Node *)0x0; local_28 = local_28->next) {
        if (local_28->tag == (Dict *)0x0) {
          bVar1 = true;
          break;
        }
      }
    }
    if (!bVar1) {
      if (((node->content != (Node *)0x0) && (node->content->tag != (Dict *)0x0)) &&
         (node->content->tag->id == TidyTag_STRONG)) {
        prvTidyReportAccessError(doc,node,0x2b8);
      }
      if (((node->content != (Node *)0x0) && (node->content->tag != (Dict *)0x0)) &&
         (node->content->tag->id == TidyTag_U)) {
        prvTidyReportAccessError(doc,node,0x2ba);
      }
      if (((node->content != (Node *)0x0) && (node->content->tag != (Dict *)0x0)) &&
         (node->content->tag->id == TidyTag_EM)) {
        prvTidyReportAccessError(doc,node,0x2b9);
      }
    }
  }
  return;
}

Assistant:

static void CheckParagraphHeader( TidyDocImpl* doc, Node* node )
{
    Bool IsNotHeader = no;
    Node* temp;

    if (Level2_Enabled( doc ))
    {
        /* Cannot contain text formatting elements */
        if (node->content != NULL)   
        {                     
            if (node->content->tag != NULL)
            {
                temp = node->content;

                while (temp != NULL)
                {
                    if (temp->tag == NULL)
                    {
                        IsNotHeader = yes;
                        break;
                    }
                        
                    temp = temp->next;
                }
            }

            if ( !IsNotHeader )
            {
                if ( nodeIsSTRONG(node->content) )
                {
                    TY_(ReportAccessError)( doc, node, POTENTIAL_HEADER_BOLD);
                }

                if ( nodeIsU(node->content) )
                {
                    TY_(ReportAccessError)( doc, node, POTENTIAL_HEADER_UNDERLINE);
                }

                if ( nodeIsEM(node->content) )
                {
                    TY_(ReportAccessError)( doc, node, POTENTIAL_HEADER_ITALICS);
                }
            }
        }
    }
}